

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O1

char ** new_attrib(char **in)

{
  char **ppcVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar5;
  ulong uVar6;
  int iVar4;
  
  uVar5 = 0xffffffff;
  do {
    iVar4 = (int)uVar5;
    uVar3 = iVar4 + 1;
    uVar5 = (ulong)uVar3;
  } while (in[uVar5] != (char *)0x0);
  ppcVar1 = (char **)__ckd_calloc__((ulong)(iVar4 + 2),8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                                    ,0xd0);
  if (uVar3 == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      pcVar2 = strdup(in[uVar6]);
      ppcVar1[uVar6] = pcVar2;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  ppcVar1[uVar6] = (char *)0x0;
  return ppcVar1;
}

Assistant:

char **new_attrib(const char **in)
{
    char **out;
    uint32 len, i;

    for (len = 0; in[len]; len++);

    out = (char **)ckd_calloc(len+1, sizeof(char *));

    for (i = 0; i < len; i++) {
	out[i] = strdup(in[i]);
    }

    out[i] = NULL;

    return out;
}